

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

int gethexa(LexState *ls)

{
  size_t sVar1;
  ZIO *z;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  
  save(ls,ls->current);
  z = ls->z;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    uVar3 = luaZ_fill(z);
  }
  else {
    pbVar2 = (byte *)z->p;
    z->p = (char *)(pbVar2 + 1);
    uVar3 = (uint)*pbVar2;
  }
  ls->current = uVar3;
  esccheck(ls,""[(long)(int)uVar3 + 1] & 0x10,"hexadecimal digit expected");
  iVar4 = luaO_hexavalue(ls->current);
  return iVar4;
}

Assistant:

static int gethexa (LexState *ls) {
  save_and_next(ls);
  esccheck (ls, lisxdigit(ls->current), "hexadecimal digit expected");
  return luaO_hexavalue(ls->current);
}